

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFARegExecSave(xmlRegExecCtxtPtr exec)

{
  int iVar1;
  int iVar2;
  xmlRegExecRollback *pxVar3;
  int *piVar4;
  int len;
  int newSize;
  xmlRegExecRollback *tmp;
  xmlRegExecCtxtPtr exec_local;
  
  if (10000000 < exec->nbPush) {
    exec->status = -6;
    return;
  }
  exec->nbPush = exec->nbPush + 1;
  if (exec->maxRollbacks <= exec->nbRollbacks) {
    iVar1 = exec->nbRollbacks;
    iVar2 = xmlGrowCapacity(exec->maxRollbacks,0x18,4,1000000000);
    if (iVar2 < 0) {
      exec->status = -5;
      return;
    }
    pxVar3 = (xmlRegExecRollback *)(*xmlRealloc)(exec->rollbacks,(long)iVar2 * 0x18);
    if (pxVar3 == (xmlRegExecRollback *)0x0) {
      exec->status = -5;
      return;
    }
    exec->rollbacks = pxVar3;
    exec->maxRollbacks = iVar2;
    memset(exec->rollbacks + iVar1,0,(long)(exec->maxRollbacks - iVar1) * 0x18);
  }
  exec->rollbacks[exec->nbRollbacks].state = exec->state;
  exec->rollbacks[exec->nbRollbacks].index = exec->index;
  exec->rollbacks[exec->nbRollbacks].nextbranch = exec->transno + 1;
  if (0 < exec->comp->nbCounters) {
    if (exec->rollbacks[exec->nbRollbacks].counts == (int *)0x0) {
      piVar4 = (int *)(*xmlMalloc)((long)exec->comp->nbCounters << 2);
      exec->rollbacks[exec->nbRollbacks].counts = piVar4;
      if (exec->rollbacks[exec->nbRollbacks].counts == (int *)0x0) {
        exec->status = -5;
        return;
      }
    }
    memcpy(exec->rollbacks[exec->nbRollbacks].counts,exec->counts,(long)exec->comp->nbCounters << 2)
    ;
  }
  exec->nbRollbacks = exec->nbRollbacks + 1;
  return;
}

Assistant:

static void
xmlFARegExecSave(xmlRegExecCtxtPtr exec) {
#ifdef MAX_PUSH
    if (exec->nbPush > MAX_PUSH) {
        exec->status = XML_REGEXP_INTERNAL_LIMIT;
        return;
    }
    exec->nbPush++;
#endif

    if (exec->nbRollbacks >= exec->maxRollbacks) {
	xmlRegExecRollback *tmp;
        int newSize;
	int len = exec->nbRollbacks;

        newSize = xmlGrowCapacity(exec->maxRollbacks, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	tmp = xmlRealloc(exec->rollbacks, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	exec->rollbacks = tmp;
	exec->maxRollbacks = newSize;
	tmp = &exec->rollbacks[len];
	memset(tmp, 0, (exec->maxRollbacks - len) * sizeof(xmlRegExecRollback));
    }
    exec->rollbacks[exec->nbRollbacks].state = exec->state;
    exec->rollbacks[exec->nbRollbacks].index = exec->index;
    exec->rollbacks[exec->nbRollbacks].nextbranch = exec->transno + 1;
    if (exec->comp->nbCounters > 0) {
	if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
	    exec->rollbacks[exec->nbRollbacks].counts = (int *)
		xmlMalloc(exec->comp->nbCounters * sizeof(int));
	    if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
		exec->status = XML_REGEXP_OUT_OF_MEMORY;
		return;
	    }
	}
	memcpy(exec->rollbacks[exec->nbRollbacks].counts, exec->counts,
	       exec->comp->nbCounters * sizeof(int));
    }
    exec->nbRollbacks++;
}